

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

void __thiscall testing::UnitTest::RecordProperty(UnitTest *this,string *key,string *value)

{
  UnitTestImpl *this_00;
  TestProperty local_50;
  
  this_00 = this->impl_;
  TestProperty::TestProperty(&local_50,key,value);
  internal::UnitTestImpl::RecordProperty(this_00,&local_50);
  TestProperty::~TestProperty(&local_50);
  return;
}

Assistant:

void UnitTest::RecordProperty(const std::string& key,
                              const std::string& value) {
  impl_->RecordProperty(TestProperty(key, value));
}